

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  NodeRef *pNVar51;
  undefined4 uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  size_t sVar56;
  ulong uVar57;
  ulong uVar58;
  ulong unaff_R13;
  size_t mask;
  long lVar59;
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar78;
  float fVar79;
  vint4 bi;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar80;
  vint4 ai;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar98;
  uint uVar100;
  uint uVar101;
  undefined1 auVar99 [16];
  uint uVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ulong local_aa8;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  ulong local_990;
  ulong local_988;
  ulong local_980;
  ulong local_978;
  NodeRef *local_970;
  undefined8 *local_968;
  NodeRef *local_960;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar89._4_4_ = uVar52;
  auVar89._0_4_ = uVar52;
  auVar89._8_4_ = uVar52;
  auVar89._12_4_ = uVar52;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar92._4_4_ = uVar52;
  auVar92._0_4_ = uVar52;
  auVar92._8_4_ = uVar52;
  auVar92._12_4_ = uVar52;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar93._4_4_ = uVar52;
  auVar93._0_4_ = uVar52;
  auVar93._8_4_ = uVar52;
  auVar93._12_4_ = uVar52;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_978 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_980 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_988 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_990 = local_978 ^ 0x10;
  uVar53 = local_980 ^ 0x10;
  uVar57 = local_988 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar97._4_4_ = iVar5;
  auVar97._0_4_ = iVar5;
  auVar97._8_4_ = iVar5;
  auVar97._12_4_ = iVar5;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar99._4_4_ = iVar5;
  auVar99._0_4_ = iVar5;
  auVar99._8_4_ = iVar5;
  auVar99._12_4_ = iVar5;
  local_968 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar51 = stack + 1;
  do {
    local_960 = pNVar51;
    if (local_960 == stack) break;
    local_970 = local_960 + -1;
    sVar56 = local_960[-1].ptr;
    do {
      uVar98 = 6;
      if ((sVar56 & 8) == 0) {
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(sVar56 + 0x20 + local_978),auVar89);
        auVar62._0_4_ = fVar2 * auVar66._0_4_;
        auVar62._4_4_ = fVar2 * auVar66._4_4_;
        auVar62._8_4_ = fVar2 * auVar66._8_4_;
        auVar62._12_4_ = fVar2 * auVar66._12_4_;
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(sVar56 + 0x20 + local_980),auVar92);
        auVar68._0_4_ = fVar3 * auVar66._0_4_;
        auVar68._4_4_ = fVar3 * auVar66._4_4_;
        auVar68._8_4_ = fVar3 * auVar66._8_4_;
        auVar68._12_4_ = fVar3 * auVar66._12_4_;
        auVar66 = vpmaxsd_avx(auVar62,auVar68);
        auVar62 = vsubps_avx(*(undefined1 (*) [16])(sVar56 + 0x20 + local_988),auVar93);
        auVar69._0_4_ = fVar4 * auVar62._0_4_;
        auVar69._4_4_ = fVar4 * auVar62._4_4_;
        auVar69._8_4_ = fVar4 * auVar62._8_4_;
        auVar69._12_4_ = fVar4 * auVar62._12_4_;
        auVar62 = vpmaxsd_avx(auVar69,auVar97);
        auVar66 = vpmaxsd_avx(auVar66,auVar62);
        auVar62 = vsubps_avx(*(undefined1 (*) [16])(sVar56 + 0x20 + local_990),auVar89);
        auVar70._0_4_ = fVar2 * auVar62._0_4_;
        auVar70._4_4_ = fVar2 * auVar62._4_4_;
        auVar70._8_4_ = fVar2 * auVar62._8_4_;
        auVar70._12_4_ = fVar2 * auVar62._12_4_;
        auVar62 = vsubps_avx(*(undefined1 (*) [16])(sVar56 + 0x20 + uVar53),auVar92);
        auVar81._0_4_ = fVar3 * auVar62._0_4_;
        auVar81._4_4_ = fVar3 * auVar62._4_4_;
        auVar81._8_4_ = fVar3 * auVar62._8_4_;
        auVar81._12_4_ = fVar3 * auVar62._12_4_;
        auVar62 = vpminsd_avx(auVar70,auVar81);
        auVar68 = vsubps_avx(*(undefined1 (*) [16])(sVar56 + 0x20 + uVar57),auVar93);
        auVar82._0_4_ = fVar4 * auVar68._0_4_;
        auVar82._4_4_ = fVar4 * auVar68._4_4_;
        auVar82._8_4_ = fVar4 * auVar68._8_4_;
        auVar82._12_4_ = fVar4 * auVar68._12_4_;
        auVar68 = vpminsd_avx(auVar82,auVar99);
        auVar62 = vpminsd_avx(auVar62,auVar68);
        auVar66 = vpcmpgtd_avx(auVar66,auVar62);
        uVar52 = vmovmskps_avx(auVar66);
        unaff_R13 = (ulong)(byte)((byte)uVar52 ^ 0xf);
      }
      if ((sVar56 & 8) == 0) {
        if (unaff_R13 == 0) {
          uVar98 = 4;
        }
        else {
          uVar55 = sVar56 & 0xfffffffffffffff0;
          lVar59 = 0;
          if (unaff_R13 != 0) {
            for (; (unaff_R13 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          sVar56 = *(size_t *)(uVar55 + lVar59 * 8);
          uVar54 = unaff_R13 - 1 & unaff_R13;
          if (uVar54 != 0) {
            local_970->ptr = sVar56;
            lVar59 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            uVar58 = uVar54 - 1;
            while( true ) {
              local_970 = local_970 + 1;
              sVar56 = *(size_t *)(uVar55 + lVar59 * 8);
              uVar58 = uVar58 & uVar54;
              if (uVar58 == 0) break;
              local_970->ptr = sVar56;
              lVar59 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              uVar54 = uVar58 - 1;
            }
          }
          uVar98 = 0;
        }
      }
    } while (uVar98 == 0);
    if (uVar98 == 6) {
      uVar55 = (ulong)((uint)sVar56 & 0xf);
      uVar98 = 0;
      uVar54 = uVar55 - 8;
      bVar60 = uVar55 != 8;
      if (bVar60) {
        uVar55 = sVar56 & 0xfffffffffffffff0;
        uVar58 = 0;
        do {
          lVar59 = uVar58 * 0xb0;
          pfVar1 = (float *)(uVar55 + 0x80 + lVar59);
          fVar25 = *pfVar1;
          fVar26 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar28 = pfVar1[3];
          pfVar1 = (float *)(uVar55 + 0x40 + lVar59);
          fVar29 = *pfVar1;
          fVar30 = pfVar1[1];
          fVar31 = pfVar1[2];
          fVar32 = pfVar1[3];
          auVar66._0_4_ = fVar25 * fVar29;
          auVar66._4_4_ = fVar26 * fVar30;
          auVar66._8_4_ = fVar27 * fVar31;
          auVar66._12_4_ = fVar28 * fVar32;
          pfVar1 = (float *)(uVar55 + 0x70 + lVar59);
          fVar33 = *pfVar1;
          fVar34 = pfVar1[1];
          fVar35 = pfVar1[2];
          fVar36 = pfVar1[3];
          pfVar1 = (float *)(uVar55 + 0x50 + lVar59);
          fVar37 = *pfVar1;
          fVar38 = pfVar1[1];
          fVar39 = pfVar1[2];
          fVar40 = pfVar1[3];
          auVar71._0_4_ = fVar33 * fVar37;
          auVar71._4_4_ = fVar34 * fVar38;
          auVar71._8_4_ = fVar35 * fVar39;
          auVar71._12_4_ = fVar36 * fVar40;
          local_898 = vsubps_avx(auVar71,auVar66);
          pfVar1 = (float *)(uVar55 + 0x60 + lVar59);
          fVar41 = *pfVar1;
          fVar42 = pfVar1[1];
          fVar43 = pfVar1[2];
          fVar44 = pfVar1[3];
          auVar72._0_4_ = fVar41 * fVar37;
          auVar72._4_4_ = fVar42 * fVar38;
          auVar72._8_4_ = fVar43 * fVar39;
          auVar72._12_4_ = fVar44 * fVar40;
          pfVar1 = (float *)(uVar55 + 0x30 + lVar59);
          fVar45 = *pfVar1;
          fVar46 = pfVar1[1];
          fVar47 = pfVar1[2];
          fVar48 = pfVar1[3];
          auVar83._0_4_ = fVar25 * fVar45;
          auVar83._4_4_ = fVar26 * fVar46;
          auVar83._8_4_ = fVar27 * fVar47;
          auVar83._12_4_ = fVar28 * fVar48;
          auVar69 = vsubps_avx(auVar83,auVar72);
          auVar84._0_4_ = fVar33 * fVar45;
          auVar84._4_4_ = fVar34 * fVar46;
          auVar84._8_4_ = fVar35 * fVar47;
          auVar84._12_4_ = fVar36 * fVar48;
          auVar103._0_4_ = fVar41 * fVar29;
          auVar103._4_4_ = fVar42 * fVar30;
          auVar103._8_4_ = fVar43 * fVar31;
          auVar103._12_4_ = fVar44 * fVar32;
          auVar70 = vsubps_avx(auVar103,auVar84);
          uVar52 = *(undefined4 *)(ray + k * 4);
          auVar104._4_4_ = uVar52;
          auVar104._0_4_ = uVar52;
          auVar104._8_4_ = uVar52;
          auVar104._12_4_ = uVar52;
          auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + lVar59),auVar104);
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar105._4_4_ = uVar52;
          auVar105._0_4_ = uVar52;
          auVar105._8_4_ = uVar52;
          auVar105._12_4_ = uVar52;
          auVar62 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x10 + lVar59),auVar105);
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar106._4_4_ = uVar52;
          auVar106._0_4_ = uVar52;
          auVar106._8_4_ = uVar52;
          auVar106._12_4_ = uVar52;
          auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + lVar59),auVar106);
          fVar67 = *(float *)(ray + k * 4 + 0x50);
          fVar78 = *(float *)(ray + k * 4 + 0x60);
          fVar80 = auVar68._0_4_;
          auVar107._0_4_ = fVar67 * fVar80;
          fVar12 = auVar68._4_4_;
          auVar107._4_4_ = fVar67 * fVar12;
          fVar15 = auVar68._8_4_;
          auVar107._8_4_ = fVar67 * fVar15;
          fVar18 = auVar68._12_4_;
          auVar107._12_4_ = fVar67 * fVar18;
          fVar94 = auVar62._0_4_;
          auVar108._0_4_ = fVar78 * fVar94;
          fVar13 = auVar62._4_4_;
          auVar108._4_4_ = fVar78 * fVar13;
          fVar16 = auVar62._8_4_;
          auVar108._8_4_ = fVar78 * fVar16;
          fVar19 = auVar62._12_4_;
          auVar108._12_4_ = fVar78 * fVar19;
          auVar62 = vsubps_avx(auVar108,auVar107);
          fVar79 = *(float *)(ray + k * 4 + 0x40);
          fVar11 = auVar66._0_4_;
          auVar63._0_4_ = fVar78 * fVar11;
          fVar14 = auVar66._4_4_;
          auVar63._4_4_ = fVar78 * fVar14;
          fVar17 = auVar66._8_4_;
          auVar63._8_4_ = fVar78 * fVar17;
          fVar20 = auVar66._12_4_;
          auVar63._12_4_ = fVar78 * fVar20;
          auVar73._0_4_ = fVar79 * fVar80;
          auVar73._4_4_ = fVar79 * fVar12;
          auVar73._8_4_ = fVar79 * fVar15;
          auVar73._12_4_ = fVar79 * fVar18;
          auVar68 = vsubps_avx(auVar73,auVar63);
          auVar74._0_4_ = fVar79 * fVar94;
          auVar74._4_4_ = fVar79 * fVar13;
          auVar74._8_4_ = fVar79 * fVar16;
          auVar74._12_4_ = fVar79 * fVar19;
          auVar85._0_4_ = fVar67 * fVar11;
          auVar85._4_4_ = fVar67 * fVar14;
          auVar85._8_4_ = fVar67 * fVar17;
          auVar85._12_4_ = fVar67 * fVar20;
          auVar81 = vsubps_avx(auVar85,auVar74);
          auVar86._0_4_ = local_898._0_4_ * fVar79 + fVar67 * auVar69._0_4_ + fVar78 * auVar70._0_4_
          ;
          auVar86._4_4_ = local_898._4_4_ * fVar79 + fVar67 * auVar69._4_4_ + fVar78 * auVar70._4_4_
          ;
          auVar86._8_4_ = local_898._8_4_ * fVar79 + fVar67 * auVar69._8_4_ + fVar78 * auVar70._8_4_
          ;
          auVar86._12_4_ =
               local_898._12_4_ * fVar79 + fVar67 * auVar69._12_4_ + fVar78 * auVar70._12_4_;
          auVar75._8_4_ = 0x80000000;
          auVar75._0_8_ = 0x8000000080000000;
          auVar75._12_4_ = 0x80000000;
          auVar66 = vandps_avx(auVar86,auVar75);
          uVar98 = auVar66._0_4_;
          auVar95._0_4_ =
               (float)(uVar98 ^ (uint)(fVar41 * auVar62._0_4_ +
                                      fVar25 * auVar81._0_4_ + fVar33 * auVar68._0_4_));
          uVar100 = auVar66._4_4_;
          auVar95._4_4_ =
               (float)(uVar100 ^
                      (uint)(fVar42 * auVar62._4_4_ +
                            fVar26 * auVar81._4_4_ + fVar34 * auVar68._4_4_));
          uVar101 = auVar66._8_4_;
          auVar95._8_4_ =
               (float)(uVar101 ^
                      (uint)(fVar43 * auVar62._8_4_ +
                            fVar27 * auVar81._8_4_ + fVar35 * auVar68._8_4_));
          uVar102 = auVar66._12_4_;
          auVar95._12_4_ =
               (float)(uVar102 ^
                      (uint)(fVar44 * auVar62._12_4_ +
                            fVar28 * auVar81._12_4_ + fVar36 * auVar68._12_4_));
          auVar96._0_4_ =
               (float)(uVar98 ^ (uint)(fVar45 * auVar62._0_4_ +
                                      fVar37 * auVar81._0_4_ + fVar29 * auVar68._0_4_));
          auVar96._4_4_ =
               (float)(uVar100 ^
                      (uint)(fVar46 * auVar62._4_4_ +
                            fVar38 * auVar81._4_4_ + fVar30 * auVar68._4_4_));
          auVar96._8_4_ =
               (float)(uVar101 ^
                      (uint)(fVar47 * auVar62._8_4_ +
                            fVar39 * auVar81._8_4_ + fVar31 * auVar68._8_4_));
          auVar96._12_4_ =
               (float)(uVar102 ^
                      (uint)(fVar48 * auVar62._12_4_ +
                            fVar40 * auVar81._12_4_ + fVar32 * auVar68._12_4_));
          auVar68 = ZEXT816(0) << 0x20;
          auVar66 = vcmpps_avx(auVar95,auVar68,5);
          auVar62 = vcmpps_avx(auVar96,auVar68,5);
          auVar66 = vandps_avx(auVar66,auVar62);
          auVar76._8_4_ = 0x7fffffff;
          auVar76._0_8_ = 0x7fffffff7fffffff;
          auVar76._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx(auVar86,auVar76);
          auVar68 = vcmpps_avx(auVar68,auVar86,4);
          auVar66 = vandps_avx(auVar66,auVar68);
          auVar64._0_4_ = auVar96._0_4_ + auVar95._0_4_;
          auVar64._4_4_ = auVar96._4_4_ + auVar95._4_4_;
          auVar64._8_4_ = auVar96._8_4_ + auVar95._8_4_;
          auVar64._12_4_ = auVar96._12_4_ + auVar95._12_4_;
          auVar68 = vcmpps_avx(auVar64,auVar62,2);
          auVar81 = auVar68 & auVar66;
          if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar81[0xf] < '\0') {
            auVar66 = vandps_avx(auVar66,auVar68);
            auVar90._0_4_ =
                 (float)(uVar98 ^ (uint)(local_898._0_4_ * fVar11 +
                                        fVar94 * auVar69._0_4_ + fVar80 * auVar70._0_4_));
            auVar90._4_4_ =
                 (float)(uVar100 ^
                        (uint)(local_898._4_4_ * fVar14 +
                              fVar13 * auVar69._4_4_ + fVar12 * auVar70._4_4_));
            auVar90._8_4_ =
                 (float)(uVar101 ^
                        (uint)(local_898._8_4_ * fVar17 +
                              fVar16 * auVar69._8_4_ + fVar15 * auVar70._8_4_));
            auVar90._12_4_ =
                 (float)(uVar102 ^
                        (uint)(local_898._12_4_ * fVar20 +
                              fVar19 * auVar69._12_4_ + fVar18 * auVar70._12_4_));
            fVar67 = *(float *)(ray + k * 4 + 0x30);
            fVar78 = auVar62._0_4_;
            auVar65._0_4_ = fVar78 * fVar67;
            fVar79 = auVar62._4_4_;
            auVar65._4_4_ = fVar79 * fVar67;
            fVar80 = auVar62._8_4_;
            auVar65._8_4_ = fVar80 * fVar67;
            fVar94 = auVar62._12_4_;
            auVar65._12_4_ = fVar94 * fVar67;
            auVar68 = vcmpps_avx(auVar65,auVar90,1);
            fVar67 = *(float *)(ray + k * 4 + 0x80);
            auVar77._0_4_ = fVar78 * fVar67;
            auVar77._4_4_ = fVar79 * fVar67;
            auVar77._8_4_ = fVar80 * fVar67;
            auVar77._12_4_ = fVar94 * fVar67;
            auVar81 = vcmpps_avx(auVar90,auVar77,2);
            auVar68 = vandps_avx(auVar68,auVar81);
            auVar81 = auVar66 & auVar68;
            if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar81[0xf] < '\0') {
              auVar66 = vandps_avx(auVar66,auVar68);
              local_a78 = auVar69._0_8_;
              uStack_a70 = auVar69._8_8_;
              local_888 = local_a78;
              uStack_880 = uStack_a70;
              local_a88 = auVar70._0_8_;
              uStack_a80 = auVar70._8_8_;
              local_878 = local_a88;
              uStack_870 = uStack_a80;
              pSVar7 = context->scene;
              auVar62 = vrcpps_avx(auVar62);
              fVar67 = auVar62._0_4_;
              auVar87._0_4_ = fVar78 * fVar67;
              fVar78 = auVar62._4_4_;
              auVar87._4_4_ = fVar79 * fVar78;
              fVar79 = auVar62._8_4_;
              auVar87._8_4_ = fVar80 * fVar79;
              fVar80 = auVar62._12_4_;
              auVar87._12_4_ = fVar94 * fVar80;
              auVar91._8_4_ = 0x3f800000;
              auVar91._0_8_ = &DAT_3f8000003f800000;
              auVar91._12_4_ = 0x3f800000;
              auVar62 = vsubps_avx(auVar91,auVar87);
              fVar67 = fVar67 + fVar67 * auVar62._0_4_;
              fVar78 = fVar78 + fVar78 * auVar62._4_4_;
              fVar79 = fVar79 + fVar79 * auVar62._8_4_;
              fVar80 = fVar80 + fVar80 * auVar62._12_4_;
              local_8a8[0] = fVar67 * auVar90._0_4_;
              local_8a8[1] = fVar78 * auVar90._4_4_;
              local_8a8[2] = fVar79 * auVar90._8_4_;
              local_8a8[3] = fVar80 * auVar90._12_4_;
              local_8c8._0_4_ = fVar67 * auVar95._0_4_;
              local_8c8._4_4_ = fVar78 * auVar95._4_4_;
              local_8c8._8_4_ = fVar79 * auVar95._8_4_;
              local_8c8._12_4_ = fVar80 * auVar95._12_4_;
              local_8b8._0_4_ = fVar67 * auVar96._0_4_;
              local_8b8._4_4_ = fVar78 * auVar96._4_4_;
              local_8b8._8_4_ = fVar79 * auVar96._8_4_;
              local_8b8._12_4_ = fVar80 * auVar96._12_4_;
              uVar52 = vmovmskps_avx(auVar66);
              local_aa8 = CONCAT44((int)((ulong)pSVar7 >> 0x20),uVar52);
              do {
                uVar10 = 0;
                if (local_aa8 != 0) {
                  for (; (local_aa8 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                  }
                }
                uVar98 = *(uint *)(lVar59 + uVar55 + 0x90 + uVar10 * 4);
                pGVar8 = (pSVar7->geometries).items[uVar98].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_aa8 = local_aa8 ^ 1L << (uVar10 & 0x3f);
                  bVar61 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar61 = false;
                }
                else {
                  uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar6 = *(undefined4 *)(local_8c8 + uVar10 * 4);
                  local_838._4_4_ = uVar6;
                  local_838._0_4_ = uVar6;
                  local_838._8_4_ = uVar6;
                  local_838._12_4_ = uVar6;
                  uVar6 = *(undefined4 *)(local_8b8 + uVar10 * 4);
                  local_828._4_4_ = uVar6;
                  local_828._0_4_ = uVar6;
                  local_828._8_4_ = uVar6;
                  local_828._12_4_ = uVar6;
                  *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar10];
                  args.context = context->user;
                  local_808 = vshufps_avx(ZEXT416(uVar98),ZEXT416(uVar98),0);
                  local_818 = *(undefined4 *)(lVar59 + uVar55 + 0xa0 + uVar10 * 4);
                  local_868 = *(undefined4 *)(local_898 + uVar10 * 4);
                  local_858 = *(undefined4 *)((long)&local_888 + uVar10 * 4);
                  local_848 = *(undefined4 *)((long)&local_878 + uVar10 * 4);
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_844 = local_848;
                  uStack_840 = local_848;
                  uStack_83c = local_848;
                  uStack_814 = local_818;
                  uStack_810 = local_818;
                  uStack_80c = local_818;
                  vcmpps_avx(ZEXT1632(local_808),ZEXT1632(local_808),0xf);
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  local_9a8 = *local_968;
                  uStack_9a0 = local_968[1];
                  args.valid = (int *)&local_9a8;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&args);
                  }
                  auVar49._8_8_ = uStack_9a0;
                  auVar49._0_8_ = local_9a8;
                  if (auVar49 == (undefined1  [16])0x0) {
                    auVar66 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar66 = auVar66 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                    }
                    auVar50._8_8_ = uStack_9a0;
                    auVar50._0_8_ = local_9a8;
                    auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,auVar50);
                    auVar66 = auVar62 ^ _DAT_01febe20;
                    auVar88._8_4_ = 0xff800000;
                    auVar88._0_8_ = 0xff800000ff800000;
                    auVar88._12_4_ = 0xff800000;
                    auVar62 = vblendvps_avx(auVar88,*(undefined1 (*) [16])(args.ray + 0x80),auVar62)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar62;
                  }
                  auVar66 = vpslld_avx(auVar66,0x1f);
                  bVar23 = (auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar24 = (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar22 = (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar21 = -1 < auVar66[0xf];
                  bVar61 = ((bVar23 && bVar24) && bVar22) && bVar21;
                  if (((bVar23 && bVar24) && bVar22) && bVar21) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar52;
                    local_aa8 = local_aa8 ^ 1L << (uVar10 & 0x3f);
                  }
                }
                uVar98 = 0;
                if (!bVar61) {
                  if (bVar60) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar98 = 1;
                  }
                  goto LAB_0033f7a1;
                }
              } while (local_aa8 != 0);
            }
          }
          uVar98 = 0;
          uVar58 = uVar58 + 1;
          bVar60 = uVar58 < uVar54;
        } while (uVar58 != uVar54);
      }
    }
LAB_0033f7a1:
    pNVar51 = local_970;
  } while ((uVar98 & 3) == 0);
  return local_960 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }